

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

char * __thiscall xe::TestResultParser::getAttribute(TestResultParser *this,char *name)

{
  bool bVar1;
  TestResultParseError *this_00;
  char *pcVar2;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *name_local;
  TestResultParser *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  bVar1 = xml::Parser::hasAttribute(&this->m_xmlParser,name);
  if (!bVar1) {
    this_00 = (TestResultParseError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Missing attribute \'",&local_b9);
    std::operator+(&local_98,&local_b8,local_18);
    std::operator+(&local_78,&local_98,"\' in <");
    pcVar2 = xml::Parser::getElementName(&this->m_xmlParser);
    std::operator+(&local_58,&local_78,pcVar2);
    std::operator+(&local_38,&local_58,">");
    TestResultParseError::TestResultParseError(this_00,&local_38);
    __cxa_throw(this_00,&TestResultParseError::typeinfo,TestResultParseError::~TestResultParseError)
    ;
  }
  pcVar2 = xml::Parser::getAttribute(&this->m_xmlParser,local_18);
  return pcVar2;
}

Assistant:

const char* TestResultParser::getAttribute (const char* name)
{
	if (!m_xmlParser.hasAttribute(name))
		throw TestResultParseError(string("Missing attribute '") + name + "' in <" + m_xmlParser.getElementName() + ">");

	return m_xmlParser.getAttribute(name);
}